

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O3

ExprTree * __thiscall PcodeCompile::createOp(PcodeCompile *this,OpCode opc,ExprTree *vn)

{
  vector<OpTpl*,std::allocator<OpTpl*>> *this_00;
  iterator __position;
  VarnodeTpl *vn_00;
  OpTpl *this_01;
  VarnodeTpl *this_02;
  OpTpl *op;
  OpTpl *local_28;
  
  vn_00 = buildTemporary(this);
  this_01 = (OpTpl *)operator_new(0x28);
  (this_01->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01->opc = opc;
  this_01->output = (VarnodeTpl *)0x0;
  local_28 = this_01;
  OpTpl::addInput(this_01,vn->outvn);
  this_01->output = vn_00;
  this_00 = (vector<OpTpl*,std::allocator<OpTpl*>> *)vn->ops;
  __position._M_current = *(OpTpl ***)(this_00 + 8);
  if (__position._M_current == *(OpTpl ***)(this_00 + 0x10)) {
    std::vector<OpTpl*,std::allocator<OpTpl*>>::_M_realloc_insert<OpTpl*const&>
              (this_00,__position,&local_28);
  }
  else {
    *__position._M_current = this_01;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  this_02 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(this_02,vn_00);
  vn->outvn = this_02;
  return vn;
}

Assistant:

ExprTree *PcodeCompile::createOp(OpCode opc,ExprTree *vn)

{				// Create new expression with output -outvn-
				// built by performing -opc- on input vn.
				// Free input expression
  VarnodeTpl *outvn = buildTemporary();
  OpTpl *op = new OpTpl(opc);
  op->addInput(vn->outvn);
  op->setOutput(outvn);
  vn->ops->push_back(op);
  vn->outvn = new VarnodeTpl(*outvn);
  return vn;
}